

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

bool AppInitSanityChecks(Context *kernel)

{
  long lVar1;
  ConstevalStringLiteral str;
  ConstevalStringLiteral str_00;
  bool bVar2;
  Result<void> *in_RDI;
  long in_FS_OFFSET;
  Result<void> result;
  bilingual_str *in_stack_fffffffffffffe28;
  bilingual_str *in_stack_fffffffffffffe50;
  Context *in_stack_fffffffffffffe58;
  undefined1 local_191;
  undefined6 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  char (*in_stack_fffffffffffffe80) [13];
  bilingual_str *in_stack_fffffffffffffe88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::kernel::SanityChecks(in_stack_fffffffffffffe58);
  bVar2 = util::Result::operator_cast_to_bool((Result<void> *)in_stack_fffffffffffffe28);
  if (bVar2) {
    bVar2 = ECC_InitSanityCheck();
    if (bVar2) {
      local_191 = LockDataDirectory((bool)in_stack_fffffffffffffe7e);
    }
    else {
      str_00.lit._6_1_ = (bool)in_stack_fffffffffffffe7e;
      str_00.lit._0_6_ = in_stack_fffffffffffffe78;
      str_00.lit._7_1_ = in_stack_fffffffffffffe7f;
      _(str_00);
      tinyformat::format<char[13]>(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      local_191 = InitError(in_stack_fffffffffffffe50);
      bilingual_str::~bilingual_str(in_stack_fffffffffffffe28);
      bilingual_str::~bilingual_str(in_stack_fffffffffffffe28);
    }
  }
  else {
    util::ErrorString<void>(in_RDI);
    InitError(in_stack_fffffffffffffe50);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffe28);
    str.lit._6_1_ = in_stack_fffffffffffffe7e;
    str.lit._0_6_ = in_stack_fffffffffffffe78;
    str.lit._7_1_ = in_stack_fffffffffffffe7f;
    _(str);
    tinyformat::format<char[13]>(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    local_191 = InitError(in_stack_fffffffffffffe50);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffe28);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffe28);
  }
  util::Result<void>::~Result((Result<void> *)in_stack_fffffffffffffe28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_191;
  }
  __stack_chk_fail();
}

Assistant:

bool AppInitSanityChecks(const kernel::Context& kernel)
{
    // ********************************************************* Step 4: sanity checks
    auto result{kernel::SanityChecks(kernel)};
    if (!result) {
        InitError(util::ErrorString(result));
        return InitError(strprintf(_("Initialization sanity check failed. %s is shutting down."), PACKAGE_NAME));
    }

    if (!ECC_InitSanityCheck()) {
        return InitError(strprintf(_("Elliptic curve cryptography sanity check failure. %s is shutting down."), PACKAGE_NAME));
    }

    // Probe the data directory lock to give an early error message, if possible
    // We cannot hold the data directory lock here, as the forking for daemon() hasn't yet happened,
    // and a fork will cause weird behavior to it.
    return LockDataDirectory(true);
}